

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint256.h
# Opt level: O2

optional<uint256> * __thiscall
detail::FromHex<uint256>(optional<uint256> *__return_storage_ptr__,detail *this,string_view str)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  string_view str_00;
  string_view str_01;
  uint256 rv;
  
  str_01._M_str = (char *)str._M_len;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (this == (detail *)0x40) {
    str_00._M_str = str_01._M_str;
    str_00._M_len = 0x40;
    bVar2 = IsHex(str_00);
    if (bVar2) {
      rv.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
      rv.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
      rv.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
      rv.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
      rv.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
      rv.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
      rv.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
      rv.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
      rv.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
      rv.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
      rv.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
      rv.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
      rv.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
      rv.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
      rv.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
      rv.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
      rv.super_base_blob<256U>.m_data._M_elems[0] = '\0';
      rv.super_base_blob<256U>.m_data._M_elems[1] = '\0';
      rv.super_base_blob<256U>.m_data._M_elems[2] = '\0';
      rv.super_base_blob<256U>.m_data._M_elems[3] = '\0';
      rv.super_base_blob<256U>.m_data._M_elems[4] = '\0';
      rv.super_base_blob<256U>.m_data._M_elems[5] = '\0';
      rv.super_base_blob<256U>.m_data._M_elems[6] = '\0';
      rv.super_base_blob<256U>.m_data._M_elems[7] = '\0';
      rv.super_base_blob<256U>.m_data._M_elems[8] = '\0';
      rv.super_base_blob<256U>.m_data._M_elems[9] = '\0';
      rv.super_base_blob<256U>.m_data._M_elems[10] = '\0';
      rv.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
      rv.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
      rv.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
      rv.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
      rv.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
      str_01._M_len = 0x40;
      base_blob<256U>::SetHexDeprecated(&rv.super_base_blob<256U>,str_01);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<uint256,_true,_true>)._M_payload.
               super__Optional_payload_base<uint256>._M_payload + 0x10) =
           rv.super_base_blob<256U>.m_data._M_elems._16_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<uint256,_true,_true>)._M_payload.
               super__Optional_payload_base<uint256>._M_payload + 0x18) =
           rv.super_base_blob<256U>.m_data._M_elems._24_8_;
      *(undefined8 *)
       &(__return_storage_ptr__->super__Optional_base<uint256,_true,_true>)._M_payload.
        super__Optional_payload_base<uint256>._M_payload =
           rv.super_base_blob<256U>.m_data._M_elems._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<uint256,_true,_true>)._M_payload.
               super__Optional_payload_base<uint256>._M_payload + 8) =
           rv.super_base_blob<256U>.m_data._M_elems._8_8_;
      (__return_storage_ptr__->super__Optional_base<uint256,_true,_true>)._M_payload.
      super__Optional_payload_base<uint256>._M_engaged = true;
      goto LAB_001f734c;
    }
  }
  (__return_storage_ptr__->super__Optional_base<uint256,_true,_true>)._M_payload.
  super__Optional_payload_base<uint256>._M_engaged = false;
LAB_001f734c:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<uintN_t> FromHex(std::string_view str)
{
    if (uintN_t::size() * 2 != str.size() || !IsHex(str)) return std::nullopt;
    uintN_t rv;
    rv.SetHexDeprecated(str);
    return rv;
}